

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O0

int gmfsetblockf77_(int64_t *MshIdx,int *KwdCod,int *BegIdx,int *EndIdx,int *MapTyp,int *MatTab,
                   int *BegInt,int *EndInt,double *BegDbl,double *EndDbl,int *BegRef,int *EndRef)

{
  long lVar1;
  int *in_RCX;
  int *in_RDX;
  uint *in_RSI;
  long *in_RDI;
  uint *in_R8;
  void *in_R9;
  long in_stack_00000008;
  long in_stack_00000010;
  long in_stack_00000018;
  long in_stack_00000020;
  long in_stack_00000028;
  KwdSct *kwd;
  GmfMshSct *msh;
  char *EndTab [1000];
  char *BegTab [1000];
  int SizTab [1000];
  int TypTab [1000];
  int i;
  long local_5e18 [1000];
  long local_3ed8 [1000];
  undefined4 local_1f98 [1000];
  undefined4 local_ff8 [1001];
  int local_54;
  void *local_50;
  uint *local_48;
  int *local_40;
  int *local_38;
  uint *local_30;
  long *local_28;
  int local_1c;
  
  lVar1 = *in_RDI + 0x110 + (long)(int)*in_RSI * 0x3300;
  if (*(int *)(lVar1 + 0xc) < 1000) {
    local_50 = in_R9;
    local_48 = in_R8;
    local_40 = in_RCX;
    local_38 = in_RDX;
    local_30 = in_RSI;
    local_28 = in_RDI;
    for (local_54 = 0; local_54 < *(int *)(lVar1 + 0xc); local_54 = local_54 + 1) {
      if (*(char *)(lVar1 + 0xfd8 + (long)local_54) == 'i') {
        local_ff8[local_54] = 10;
        local_1f98[local_54] = 1;
        if ((F77RefFlg[(int)*local_30] == '\0') || (local_54 != *(int *)(lVar1 + 0xc) + -1)) {
          local_3ed8[local_54] = in_stack_00000008 + (long)local_54 * 4;
          local_5e18[local_54] = in_stack_00000010 + (long)local_54 * 4;
        }
        else {
          local_3ed8[local_54] = in_stack_00000028;
          local_5e18[local_54] = (long)kwd;
        }
      }
      else if (*(char *)(lVar1 + 0xfd8 + (long)local_54) == 'r') {
        local_ff8[local_54] = 9;
        local_1f98[local_54] = 1;
        local_3ed8[local_54] = in_stack_00000018 + (long)local_54 * 8;
        local_5e18[local_54] = in_stack_00000020 + (long)local_54 * 8;
      }
    }
    local_1c = GmfSetBlock(*local_28,(int)(ulong)*local_30,(long)*local_38,(long)*local_40,
                           (int)(ulong)*local_48,local_50,(void *)0x0,100,local_ff8,local_1f98,
                           local_3ed8,local_5e18);
  }
  else {
    local_1c = 0;
  }
  return local_1c;
}

Assistant:

int APIF77(gmfsetblockf77)(int64_t *MshIdx, int *KwdCod,
                           int *BegIdx, int *EndIdx,
                           int *MapTyp, int *MatTab,
                           int *BegInt, int *EndInt,
                           double *BegDbl, double *EndDbl,
                           int *BegRef, int *EndRef)
{
   int         i, TypTab[ MaxArg ], SizTab[ MaxArg ];
   char        *BegTab[ MaxArg ], *EndTab[ MaxArg ];
   GmfMshSct   *msh = (GmfMshSct *)*MshIdx;
   KwdSct      *kwd = &msh->KwdTab[ *KwdCod ];

   // Fortran mode will expand all fields as a separate scalar so we need space
   if(kwd->SolSiz >= MaxArg)
      return(0);

   // Fortran call to setblock uses the GmfArgTab mode where pointers are passed
   // through tables: types[], vec sizes[], begin pointers[] and end pointers[]
   for(i=0;i<kwd->SolSiz;i++)
   {
      if(kwd->fmt[i] == 'i')
      {
         TypTab[i] = GmfInt;
         SizTab[i] = 1;

         if( (F77RefFlg[ *KwdCod ]) && (i == kwd->SolSiz-1) )
         {
            BegTab[i] = (char *)BegRef;
            EndTab[i] = (char *)EndRef;
         }
         else
         {
            BegTab[i] = (char *)&BegInt[i];
            EndTab[i] = (char *)&EndInt[i];
         }
      }else if(kwd->fmt[i] == 'r')
      {
         TypTab[i] = GmfDouble;
         SizTab[i] = 1;
         BegTab[i] = (char *)&BegDbl[i];
         EndTab[i] = (char *)&EndDbl[i];
      }
   }

   return(GmfSetBlock(  *MshIdx, *KwdCod, *BegIdx, *EndIdx, *MapTyp, MatTab,
                        NULL, GmfArgTab, TypTab, SizTab, BegTab, EndTab ));
}